

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void do_cmd_knowledge_shapechange(char *name,wchar_t row)

{
  int iVar1;
  menu_iter *iter;
  mouseclick mVar2;
  bool bVar3;
  ui_event uVar4;
  wchar_t local_b8;
  ui_event_type local_a8;
  undefined1 local_90 [8];
  ui_event ke;
  ui_event ke0;
  wchar_t hnew;
  wchar_t wnew;
  _Bool recall;
  player_shape *ppStack_68;
  wchar_t i;
  player_shape *s;
  _Bool redraw;
  wchar_t wStack_58;
  _Bool displaying;
  wchar_t mark_old;
  wchar_t mark;
  wchar_t h;
  char **narray;
  player_shape **sarray;
  menu_conflict *m;
  wchar_t count;
  region_conflict list_region;
  region_conflict header_region;
  wchar_t row_local;
  char *name_local;
  
  list_region.width = L'\0';
  list_region.page_rows = L'\0';
  stack0xffffffffffffffcc = 0x600000000;
  list_region.col = L'\xffffffff';
  list_region.row = L'\xfffffffe';
  m._0_4_ = count_interesting_shapes();
  if ((wchar_t)m != L'\0') {
    iter = menu_find_iter(MN_ITER_STRINGS);
    sarray = (player_shape **)menu_new(MN_SKIN_SCROLL,iter);
    narray = (char **)mem_alloc((long)(wchar_t)m << 3);
    wnew = L'\0';
    for (ppStack_68 = shapes; ppStack_68 != (player_shape *)0x0; ppStack_68 = ppStack_68->next) {
      iVar1 = strcmp(ppStack_68->name,"normal");
      if (iVar1 != 0) {
        narray[wnew] = (char *)ppStack_68;
        wnew = wnew + L'\x01';
      }
    }
    sort(narray,(long)(wchar_t)m,8,compare_shape_names);
    _mark = mem_alloc((long)(wchar_t)m << 3);
    for (wnew = L'\0'; wnew < (wchar_t)m; wnew = wnew + L'\x01') {
      *(undefined8 *)((long)_mark + (long)wnew * 8) = *(undefined8 *)(narray[wnew] + 8);
    }
    menu_setpriv((menu *)sarray,(wchar_t)m,_mark);
    menu_layout((menu *)sarray,(region *)((long)&m + 4));
    *(uint *)(sarray + 10) = *(uint *)(sarray + 10) | 0x10;
    screen_save();
    clear_from(L'\0');
    mark_old = L'\0';
    wStack_58 = L'\0';
    s._4_4_ = L'\xffffffff';
    s._3_1_ = 1;
    s._2_1_ = 1;
    while ((s._3_1_ & 1) != 0) {
      hnew._3_1_ = 0;
      ke._4_8_ = 0;
      ke0.type = EVT_NONE;
      Term_get_size((int *)&ke0.key.mods,(int *)&ke0.key.code);
      if (mark_old != ke0.key.code) {
        mark_old = ke0.key.code;
        s._2_1_ = 1;
      }
      if ((s._2_1_ & 1) != 0) {
        region_erase((region *)&list_region.width);
        prt("Knowledge - shapes",L'\x02',L'\0');
        prt("Name",L'\x04',L'\0');
        wnew = L'\0';
        while( true ) {
          if ((int)ke0._8_4_ < 0x50) {
            local_b8 = ke0._8_4_;
          }
          else {
            local_b8 = L'P';
          }
          if (local_b8 <= wnew) break;
          Term_putch(wnew,L'\x05',L'\x01',L'=');
          wnew = wnew + L'\x01';
        }
        prt("<dir>, \'r\' to recall, ESC",mark_old + L'\xfffffffe',L'\0');
        s._2_1_ = 0;
      }
      if (s._4_4_ != wStack_58) {
        s._4_4_ = wStack_58;
        *(wchar_t *)(sarray + 0x12) = wStack_58;
      }
      menu_refresh((menu *)sarray,false);
      handle_stuff(player);
      uVar4 = inkey_ex();
      mVar2 = uVar4.mouse;
      local_a8 = CONCAT31(local_a8._1_3_,uVar4.key.mods);
      ke.type = local_a8;
      local_90._0_4_ = uVar4.type;
      local_90 = (undefined1  [8])mVar2;
      if (local_90._0_4_ == EVT_MOUSE) {
        menu_handle_mouse((menu *)sarray,(ui_event *)local_90,(ui_event *)&ke.mouse.x);
      }
      else {
        bVar3 = local_90._0_4_ == EVT_KBRD;
        if (bVar3) {
          menu_handle_keypress((menu *)sarray,(ui_event *)local_90,(ui_event *)&ke.mouse.x);
        }
      }
      if (ke.key.code != 0) {
        local_90 = (undefined1  [8])ke._4_8_;
        ke.type = ke0.type;
      }
      if (local_90._0_4_ == EVT_KBRD) {
        if ((local_90._4_4_ == 0x72) || (local_90._4_4_ == 0x52)) {
          hnew._3_1_ = 1;
        }
      }
      else if (local_90._0_4_ == EVT_ESCAPE) {
        s._3_1_ = 0;
      }
      else if (local_90._0_4_ == EVT_MOVE) {
        wStack_58 = *(wchar_t *)(sarray + 0x12);
      }
      else if ((local_90._0_4_ == EVT_SELECT) && (wStack_58 == *(wchar_t *)(sarray + 0x12))) {
        hnew._3_1_ = 1;
      }
      if ((hnew._3_1_ & 1) != 0) {
        if ((wStack_58 < L'\0') || ((wchar_t)m <= wStack_58)) {
          __assert_fail("mark >= 0 && mark < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                        ,0xc6e,"void do_cmd_knowledge_shapechange(const char *, int)");
        }
        shape_lore((player_shape *)narray[wStack_58]);
      }
    }
    screen_load();
    mem_free(_mark);
    mem_free(narray);
    menu_free((menu *)sarray);
  }
  return;
}

Assistant:

static void do_cmd_knowledge_shapechange(const char *name, int row)
{
	region header_region = { 0, 0, -1, 5 };
	region list_region = { 0, 6, -1, -2 };
	int count = count_interesting_shapes();
	struct menu* m;
	struct player_shape **sarray;
	const char **narray;
	int h, mark, mark_old;
	bool displaying, redraw;
	struct player_shape *s;
	int i;

	if (!count) {
		return;
	}

	m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_STRINGS));

	/* Set up an easily indexable list of the interesting shapes. */
	sarray = mem_alloc(count * sizeof(*sarray));
	for (s = shapes, i = 0; s; s = s->next) {
		if (streq(s->name, "normal")) {
			continue;
		}
		sarray[i] = s;
		++i;
	}

	/*
	 * Sort them alphabetically by name and set up an array with just the
	 * names.
	 */
	sort(sarray, count, sizeof(sarray[0]), compare_shape_names);
	narray = mem_alloc(count * sizeof(*narray));
	for (i = 0; i < count; ++i) {
		narray[i] = sarray[i]->name;
	}

	menu_setpriv(m, count, narray);
	menu_layout(m, &list_region);
	m->flags |= MN_DBL_TAP;

	screen_save();
	clear_from(0);

	h = 0;
	mark = 0;
	mark_old = -1;
	displaying = true;
	redraw = true;
	while (displaying) {
		bool recall = false;
		int wnew, hnew;
		ui_event ke0 = EVENT_EMPTY;
		ui_event ke;

		Term_get_size(&wnew, &hnew);
		if (h != hnew) {
			h = hnew;
			redraw = true;
		}

		if (redraw) {
			region_erase(&header_region);
			prt("Knowledge - shapes", 2, 0);
			prt("Name", 4, 0);
			for (i = 0; i < MIN(80, wnew); i++) {
				Term_putch(i, 5, COLOUR_WHITE, L'=');
			}
			prt("<dir>, 'r' to recall, ESC", h - 2, 0);
			redraw = false;
		}

		if (mark_old != mark) {
			mark_old = mark;
			m->cursor = mark;
		}

		menu_refresh(m, false);

		handle_stuff(player);

		ke = inkey_ex();
		if (ke.type == EVT_MOUSE) {
			menu_handle_mouse(m, &ke, &ke0);
		} else if (ke.type == EVT_KBRD) {
			menu_handle_keypress(m, &ke, &ke0);
		}
		if (ke0.type != EVT_NONE) {
			ke = ke0;
		}

		switch (ke.type) {
			case EVT_KBRD:
				if (ke.key.code == 'r' || ke.key.code == 'R') {
					recall = true;
				}
				break;

			case EVT_ESCAPE:
				displaying = false;
				break;

			case EVT_SELECT:
				if (mark == m->cursor) {
					recall = true;
				}
				break;

			case EVT_MOVE:
				mark = m->cursor;
				break;

			default:
				break;
		}

		if (recall) {
			assert(mark >= 0 && mark < count);
			shape_lore(sarray[mark]);
		}
	}

	screen_load();

	mem_free(narray);
	mem_free(sarray);
	menu_free(m);
}